

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleRegressor::SharedDtor(TreeEnsembleRegressor *this)

{
  TreeEnsembleParameters *this_00;
  Arena *pAVar1;
  LogMessage *other;
  TreeEnsembleRegressor *pTVar2;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  TreeEnsembleRegressor *local_10;
  TreeEnsembleRegressor *this_local;
  
  local_10 = this;
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar1 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x622);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  pTVar2 = internal_default_instance();
  if ((this != pTVar2) && (this_00 = this->treeensemble_, this_00 != (TreeEnsembleParameters *)0x0))
  {
    TreeEnsembleParameters::~TreeEnsembleParameters(this_00);
    operator_delete(this_00,0x48);
  }
  return;
}

Assistant:

inline void TreeEnsembleRegressor::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete treeensemble_;
}